

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remotecache.h
# Opt level: O2

int __thiscall
snmalloc::
RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>::init
          (RemoteDeallocCache<snmalloc::StandardConfigClientMeta<snmalloc::NoClientMetaDataProvider>_>
           *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  value_type *l;
  
  for (lVar1 = 0; lVar1 != 0x1800; lVar1 = lVar1 + 0x18) {
    *(long *)((long)(this->list)._M_elems[0].end._M_elems + lVar1) =
         (long)(this->list)._M_elems[0].head._M_elems + lVar1;
    *(undefined8 *)((long)(this->list)._M_elems[0].head._M_elems + lVar1) = 0;
  }
  this->capacity = 0x4000;
  (this->batching).open_meta._M_elems[0] = 0;
  (this->batching).open_meta._M_elems[1] = 0;
  (this->batching).open_meta._M_elems[2] = 0;
  (this->batching).open_meta._M_elems[3] = 0;
  (this->batching).open_meta._M_elems[4] = 0;
  (this->batching).open_meta._M_elems[5] = 0;
  (this->batching).open_meta._M_elems[6] = 0;
  (this->batching).open_meta._M_elems[7] = 0;
  (this->batching).open_meta._M_elems[8] = 0;
  (this->batching).open_meta._M_elems[9] = 0;
  (this->batching).open_meta._M_elems[10] = 0;
  (this->batching).open_meta._M_elems[0xb] = 0;
  (this->batching).open_meta._M_elems[0xc] = 0;
  (this->batching).open_meta._M_elems[0xd] = 0;
  (this->batching).open_meta._M_elems[0xe] = 0;
  (this->batching).open_meta._M_elems[0xf] = 0;
  return 0x1800;
}

Assistant:

void init()
    {
#ifndef NDEBUG
      initialised = true;
#endif
      for (auto& l : list)
      {
        // We do not need to initialise with a particular slab, so pass
        // a null address.
        l.init(0, RemoteAllocator::key_global, NO_KEY_TWEAK);
      }
      capacity = REMOTE_CACHE;

      batching.init();
    }